

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O2

void gnuplotio::
     deref_and_print<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<std::pair<double,int>const*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::pair<double,int>>,gnuplotio::ModeBinary>
               (gnuplotio *stream,long *arg)

{
  size_t i;
  ulong uVar1;
  long lVar2;
  
  lVar2 = 0;
  for (uVar1 = 0; uVar1 < (ulong)(arg[1] - *arg >> 4); uVar1 = uVar1 + 1) {
    deref_and_print<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<std::pair<double,int>const*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::pair<double,int>>,gnuplotio::ModeBinary>
              (stream,*arg + lVar2);
    lVar2 = lVar2 + 0x10;
  }
  return;
}

Assistant:

void deref_and_print(std::ostream &stream, const VecOfRange<T> &arg, PrintMode) {
    if(PrintMode::is_binfmt && arg.rvec.empty()) throw plotting_empty_container();
    for(size_t i=0; i<arg.rvec.size(); i++) {
        if(i && PrintMode::is_text) stream << " ";
        deref_and_print(stream, arg.rvec[i], PrintMode());
    }
}